

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void statement(LexState *ls)

{
  unsigned_short *puVar1;
  byte bVar2;
  byte bVar3;
  FuncState *pFVar4;
  LocVar *pLVar5;
  LexState *ls_00;
  ravi_type_map rVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  TString *pTVar13;
  long lVar14;
  long lVar15;
  Labeldesc *pLVar16;
  expkind eVar17;
  long lVar18;
  char *pcVar19;
  FuncState *pFVar20;
  expdesc *info;
  uint uVar21;
  ulong uVar22;
  int iVar23;
  Labellist *l;
  Fornuminfo *pusertype;
  ulong local_740;
  FuncState **local_738;
  expdesc e;
  Fornuminfo tlimit;
  Fornuminfo tidx;
  anon_union_16_4_e6d17769_for_u aaStack_688 [67];
  BlockCnt bl;
  
  iVar9 = ls->linenumber;
  enterlevel(ls);
  iVar8 = (ls->t).token;
  switch(iVar8) {
  case 0x102:
  case 0x10a:
    iVar9 = luaK_jump(ls->fs);
    gotostat(ls,iVar9);
    break;
  case 0x103:
    luaX_next(ls);
    block(ls);
    check_match(ls,0x106,0x103,iVar9);
    break;
  case 0x108:
    pFVar20 = ls->fs;
    iVar7 = 1;
    enterblock(pFVar20,&bl,'\x01');
    luaX_next(ls);
    pTVar13 = str_checkname(ls);
    iVar8 = (ls->t).token;
    if ((iVar8 == 0x2c) || (iVar8 == 0x10c)) {
      pFVar4 = ls->fs;
      tidx.type_map = 0;
      tidx.is_constant = 0;
      tidx.int_value = 0;
      bVar3 = pFVar4->freereg;
      new_localvarliteral_(ls,"(for generator)",0xf);
      new_localvarliteral_(ls,"(for state)",0xb);
      new_localvarliteral_(ls,"(for control)",0xd);
      new_localvar(ls,pTVar13,0xffffffff,(TString *)0x0);
      while (iVar8 = testnext(ls,0x2c), iVar8 != 0) {
        pTVar13 = str_checkname(ls);
        new_localvar(ls,pTVar13,0xffffffff,(TString *)0x0);
        iVar7 = iVar7 + 1;
      }
      checknext(ls,0x10c);
      iVar8 = ls->linenumber;
      iVar11 = explist(ls,(expdesc *)&tidx);
      adjust_assign(ls,3,iVar11,(expdesc *)&tidx);
      luaK_checkstack(pFVar4,3);
      iVar11 = 0;
      info = (expdesc *)0x0;
    }
    else {
      if (iVar8 != 0x3d) {
        pcVar19 = "\'=\' or \'in\' expected";
        goto LAB_0011ba11;
      }
      pFVar4 = ls->fs;
      bVar3 = pFVar4->freereg;
      new_localvarliteral_(ls,"(for index)",0xb);
      new_localvarliteral_(ls,"(for limit)",0xb);
      new_localvarliteral_(ls,"(for step)",10);
      new_localvar(ls,pTVar13,0xffffffff,(TString *)0x0);
      lVar14 = (long)pFVar4->nlocvars;
      checknext(ls,0x3d);
      e.u.info = 0;
      e.k = VLOCAL;
      e._4_4_ = 0;
      tidx.int_value = 0;
      tlimit.int_value = 0;
      tidx.type_map = 0xffffffff;
      tidx.is_constant = 0;
      tlimit.type_map = 0xffffffff;
      tlimit.is_constant = 0;
      exp1(ls,&tidx);
      checknext(ls,0x2c);
      exp1(ls,&tlimit);
      iVar8 = testnext(ls,0x2c);
      if (iVar8 == 0) {
        e._4_4_ = 1;
        e.u.info = 1;
        bVar2 = pFVar4->freereg;
        iVar8 = luaK_intK(pFVar4,1);
        luaK_codek(pFVar4,(uint)bVar2,iVar8);
        luaK_reserveregs(pFVar4,1);
        eVar17 = VLOCAL;
      }
      else {
        exp1(ls,(Fornuminfo *)&e);
        eVar17 = e.k;
      }
      info = (expdesc *)0x0;
      if ((tidx.type_map == tlimit.type_map) && (tlimit.type_map == eVar17)) {
        if ((tidx.type_map == 0x10) || (tidx.type_map == 8)) {
          pLVar5 = pFVar4->f->locvars;
          info = &e;
          if (e._4_4_ == 0) {
            info = (expdesc *)0x0;
          }
          if (tidx.type_map != 8) {
            info = (expdesc *)0x0;
          }
          pLVar5[lVar14 + -1].ravi_type_map = tidx.type_map;
          pLVar5[lVar14 + -2].ravi_type_map = tidx.type_map;
          pLVar5[lVar14 + -3].ravi_type_map = tidx.type_map;
          pLVar5[lVar14 + -4].ravi_type_map = tidx.type_map;
          if ((((((byte)ravi_parser_debug & 4) != 0) &&
               (raviY_printf(pFVar4,"fornum -> setting type for index %v\n",pLVar5 + lVar14 + -4),
               ((byte)ravi_parser_debug & 4) != 0)) &&
              (raviY_printf(pFVar4,"fornum -> setting type for limit %v\n",pLVar5 + lVar14 + -3),
              ((byte)ravi_parser_debug & 4) != 0)) &&
             (raviY_printf(pFVar4,"fornum -> setting type for step %v\n",pLVar5 + lVar14 + -2),
             ((byte)ravi_parser_debug & 4) != 0)) {
            raviY_printf(pFVar4,"fornum -> setting type for variable %v\n",pLVar5 + lVar14 + -1);
          }
        }
        else {
          info = (expdesc *)0x0;
        }
      }
      iVar7 = 1;
      iVar8 = iVar9;
      iVar11 = iVar7;
    }
    forbody(ls,(uint)bVar3,iVar8,iVar7,iVar11,(Fornuminfo *)info);
    check_match(ls,0x106,0x108,iVar9);
    goto LAB_0011b974;
  case 0x109:
    bl._0_16_ = ZEXT816(0) << 0x40;
    tidx.type_map = 0;
    tidx.is_constant = 0;
    tidx.int_value = 0;
    bl.nactvar = '\0';
    bl.upval = '\0';
    bl.isloop = '\0';
    bl.insidetbc = '\0';
    bl._20_4_ = 0;
    luaX_next(ls);
    singlevar(ls,(expdesc *)&tidx);
    while (iVar8 = (ls->t).token, iVar8 == 0x2e) {
      fieldsel(ls,(expdesc *)&tidx);
    }
    if (iVar8 == 0x3a) {
      fieldsel(ls,(expdesc *)&tidx);
    }
    if (((byte)ravi_parser_debug & 4) != 0) {
      raviY_printf(ls->fs,"funcstat -> declaring function %e\n",&tidx);
    }
    body(ls,(expdesc *)&bl,(uint)(iVar8 == 0x3a),iVar9,0);
    luaK_storevar(ls->fs,(expdesc *)&tidx,(expdesc *)&bl);
    luaK_fixline(ls->fs,iVar9);
    break;
  case 0x10b:
    pFVar20 = ls->fs;
    tlimit.type_map = 0xffffffff;
    do {
      pFVar4 = ls->fs;
      tidx.type_map = 0;
      tidx.is_constant = 0;
      tidx.int_value = 0;
      luaX_next(ls);
      expr(ls,(expdesc *)&tidx);
      checknext(ls,0x114);
      if (((ls->t).token | 8U) == 0x10a) {
        luaK_goiffalse(ls->fs,(expdesc *)&tidx);
        enterblock(pFVar4,&bl,'\0');
        gotostat(ls,0);
        do {
          iVar8 = testnext(ls,0x3b);
        } while (iVar8 != 0);
        uVar21 = (ls->t).token - 0x104;
        if ((0x1e < uVar21) || ((0x40000007U >> (uVar21 & 0x1f) & 1) == 0)) {
          iVar8 = luaK_jump(pFVar4);
          goto LAB_0011af4c;
        }
        leaveblock(pFVar4);
      }
      else {
        luaK_goiftrue(ls->fs,(expdesc *)&tidx);
        enterblock(pFVar4,&bl,'\0');
        iVar8 = 0;
LAB_0011af4c:
        statlist(ls);
        leaveblock(pFVar4);
        if (((ls->t).token & 0xfffffffeU) == 0x104) {
          iVar7 = luaK_jump(pFVar4);
          luaK_concat(pFVar4,(int *)&tlimit,iVar7);
        }
        luaK_patchtohere(pFVar4,iVar8);
      }
    } while ((ls->t).token == 0x105);
    iVar8 = testnext(ls,0x104);
    if (iVar8 != 0) {
      block(ls);
    }
    check_match(ls,0x106,0x10b,iVar9);
    rVar6 = tlimit.type_map;
    goto LAB_0011b0e4;
  case 0x10d:
    luaX_next(ls);
    iVar9 = testnext(ls,0x109);
    if (iVar9 == 0) {
      e.usertype = (TString *)0x0;
      e.k = VVOID;
      e._4_4_ = 0;
      e.u.info = 0;
      e.u.ind.key_ravi_type_map = 0;
      e.u.ind.usertype = (TString *)0x0;
      e.t = 0;
      e.f = 0;
      e.ravi_type_map = 0xffffffff;
      e._36_4_ = 0;
      e.pc = -1;
      e._52_4_ = 0;
      memset(&bl,0,0x21c);
      pusertype = &tidx;
      memset(pusertype,0,0x438);
      uVar22 = 0;
      do {
        local_740 = uVar22;
        rVar6 = declare_localvar(ls,(TString **)pusertype);
        *(ravi_type_map *)((long)&bl.previous + local_740 * 4) = rVar6;
        if (local_740 == 0x86) {
          pcVar19 = "too many local variables";
          goto LAB_0011ba11;
        }
        uVar22 = local_740 + 1;
        iVar9 = testnext(ls,0x2c);
        pusertype = (Fornuminfo *)&pusertype->int_value;
      } while (iVar9 != 0);
      iVar9 = testnext(ls,0x3d);
      iVar8 = (int)uVar22;
      if (iVar9 == 0) {
        e.k = VVOID;
        local_740 = uVar22 & 0xffffffff;
        iVar9 = 0;
        pFVar20 = ls->fs;
LAB_0011b85e:
        bVar3 = pFVar20->freereg;
        uVar21 = (uint)bVar3;
        iVar7 = (int)local_740;
        luaK_reserveregs(pFVar20,iVar7);
        luaK_nil(pFVar20,uVar21,iVar7);
        for (; (int)uVar21 < (int)(iVar7 + (uint)bVar3); uVar21 = uVar21 + 1) {
          iVar11 = register_to_locvar_index(pFVar20,uVar21);
          uVar12 = pFVar20->f->locvars[iVar11].ravi_type_map;
          if ((uVar12 == 0x10) || (uVar12 == 8)) {
            luaK_codeABC(pFVar20,(uVar12 == 0x10) + OP_RAVI_LOADIZ,uVar21,0,0);
          }
          else if ((uVar12 & 1) == 0) {
            raviY_typemap_string(uVar12,(char *)&tlimit);
            ls_00 = pFVar20->ls;
            pcVar19 = luaO_pushfstring(ls_00->L,"uninitialized %s in local variable",&tlimit);
            luaX_syntaxerror(ls_00,pcVar19);
          }
        }
      }
      else {
        expr(ls,&e);
        ravi_typecheck(ls,&e,(ravi_type_map *)&bl,(TString **)&tidx,iVar8,0);
        local_740 = local_740 & 0xffffffff;
        iVar9 = 1;
        while( true ) {
          iVar7 = testnext(ls,0x2c);
          iVar11 = (int)local_740;
          if (iVar7 == 0) break;
          luaK_exp2nextreg(ls->fs,&e);
          expr(ls,&e);
          ravi_typecheck(ls,&e,(ravi_type_map *)&bl,(TString **)&tidx,iVar8,iVar9);
          iVar9 = iVar9 + 1;
          local_740 = (ulong)(iVar11 - 1);
        }
        pFVar20 = ls->fs;
        if (e.k - VCALL < 2) {
          iVar7 = -1;
          if (-1 < iVar11) {
            iVar7 = iVar11;
          }
          luaK_setreturns(pFVar20,&e,iVar7 + 1);
          if ((iVar7 + 1 != 0) && (e.k == VCALL)) {
            uVar21 = ls->fs->f->code[e.u.info];
            if ((char)uVar21 != '$') {
              __assert_fail("((OpCode)(((*pc)&0xff))) == OP_CALL",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                            ,0x2a8,"void ravi_coercetype(LexState *, expdesc *, int)");
            }
            uVar21 = uVar21 >> 8 & 0x7f;
            iVar23 = iVar7 + 1 + uVar21;
            while (uVar21 = uVar21 + 1, (int)uVar21 < iVar23) {
              iVar10 = register_to_locvar_index(ls->fs,uVar21);
              pLVar5 = ls->fs->f->locvars;
              ravi_code_typecoersion(ls,uVar21,pLVar5[iVar10].ravi_type_map,pLVar5[iVar10].usertype)
              ;
            }
          }
          if (0 < iVar11) {
            luaK_reserveregs(pFVar20,iVar7);
          }
        }
        else {
          if (e.k != VVOID) {
            luaK_exp2nextreg(pFVar20,&e);
          }
          if (0 < iVar11) goto LAB_0011b85e;
        }
      }
      local_738 = &ls->fs;
      if (iVar8 < iVar9) {
        (*local_738)->freereg = (*local_738)->freereg + (char)local_740;
      }
      adjustlocalvars(ls,iVar8);
      break;
    }
    iVar9 = 0;
    goto LAB_0011b1ae;
  case 0x10e:
    luaX_next(ls);
    iVar9 = 1;
LAB_0011b1ae:
    localfunc(ls,iVar9);
    break;
  case 0x112:
    pFVar20 = ls->fs;
    iVar8 = luaK_getlabel(pFVar20);
    enterblock(pFVar20,(BlockCnt *)&tidx,'\x01');
    enterblock(pFVar20,&bl,'\0');
    luaX_next(ls);
    statlist(ls);
    check_match(ls,0x116,0x112,iVar9);
    iVar9 = cond(ls);
    if (bl.upval != '\0') {
      luaK_patchclose(pFVar20,iVar9,(uint)bl.nactvar);
    }
    leaveblock(pFVar20);
    luaK_patchlist(pFVar20,iVar9,iVar8);
LAB_0011b974:
    leaveblock(pFVar20);
    break;
  case 0x113:
    luaX_next(ls);
    pFVar20 = ls->fs;
    uVar12 = 0;
    tidx.type_map = 0;
    tidx.is_constant = 0;
    tidx.int_value = 0;
    iVar9 = (ls->t).token;
    uVar21 = iVar9 - 0x104;
    if ((uVar21 < 0x1f) && ((0x40040007U >> (uVar21 & 0x1f) & 1) != 0)) {
      uVar12 = 0;
      iVar8 = 0;
    }
    else {
      iVar8 = 0;
      if (iVar9 != 0x3b) {
        iVar8 = explist(ls,(expdesc *)&tidx);
        if (tidx.type_map - 0xd < 2) {
          luaK_setreturns(pFVar20,(expdesc *)&tidx,-1);
          if (((iVar8 == 1 && tidx.type_map == 0xd) && (pFVar20->bl->insidetbc == '\0')) &&
             (*(undefined1 *)(pFVar20->f->code + tidx.int_value) = 0x25,
             (pFVar20->f->code[tidx.int_value] >> 8 & 0x7f) != (uint)pFVar20->nactvar)) {
            __assert_fail("((int)(((((fs)->f->code[(&e)->u.info]))>>8)&0x7f)) == fs->nactvar",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                          ,0x959,"void retstat(LexState *)");
          }
          uVar12 = (uint)pFVar20->nactvar;
          iVar8 = -1;
        }
        else if (iVar8 == 1) {
          uVar12 = luaK_exp2anyreg(pFVar20,(expdesc *)&tidx);
          iVar8 = 1;
        }
        else {
          luaK_exp2nextreg(pFVar20,(expdesc *)&tidx);
          uVar12 = (uint)pFVar20->nactvar;
          if (iVar8 != pFVar20->freereg - uVar12) {
            __assert_fail("nret == fs->freereg - first",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                          ,0x964,"void retstat(LexState *)");
          }
        }
      }
    }
    luaK_ret(pFVar20,uVar12,iVar8);
    testnext(ls,0x3b);
    break;
  case 0x117:
    pFVar20 = ls->fs;
    luaX_next(ls);
    iVar8 = luaK_getlabel(pFVar20);
    rVar6 = cond(ls);
    enterblock(pFVar20,(BlockCnt *)&tidx,'\x01');
    checknext(ls,0x103);
    block(ls);
    iVar7 = luaK_jump(pFVar20);
    luaK_patchlist(pFVar20,iVar7,iVar8);
    check_match(ls,0x106,0x117,iVar9);
    leaveblock(pFVar20);
LAB_0011b0e4:
    luaK_patchtohere(pFVar20,rVar6);
    break;
  default:
    if (iVar8 == 0x121) {
      luaX_next(ls);
      pTVar13 = str_checkname(ls);
      pFVar20 = ls->fs;
      l = &ls->dyd->label;
      lVar14 = (long)pFVar20->bl->firstlabel;
      lVar15 = lVar14 + -1;
      lVar14 = lVar14 * 0x18;
      while (lVar18 = lVar14, lVar15 = lVar15 + 1, lVar15 < (ls->dyd->label).n) {
        lVar14 = lVar18 + 0x18;
        if (*(TString **)((long)&l->arr->name + lVar18) == pTVar13) {
          pcVar19 = luaO_pushfstring(pFVar20->ls->L,"label \'%s\' already defined on line %d",
                                     pTVar13 + 1,(ulong)*(uint *)((long)&l->arr->line + lVar18));
          semerror(pFVar20->ls,pcVar19);
        }
      }
      checknext(ls,0x121);
      iVar8 = luaK_getlabel(pFVar20);
      iVar9 = newlabelentry(ls,l,pTVar13,iVar9,iVar8);
      while ((iVar8 = (ls->t).token, iVar8 == 0x3b || (iVar8 == 0x121))) {
        statement(ls);
      }
      if ((iVar8 - 0x104U < 3) || (iVar8 == 0x122)) {
        pLVar16 = l->arr;
        pLVar16[iVar9].nactvar = pFVar20->bl->nactvar;
      }
      else {
        pLVar16 = l->arr;
      }
      findgotos(ls,pLVar16 + iVar9);
      break;
    }
    if (iVar8 == 0x3b) {
      luaX_next(ls);
      break;
    }
  case 0x104:
  case 0x105:
  case 0x106:
  case 0x107:
  case 0x10c:
  case 0x10f:
  case 0x110:
  case 0x111:
  case 0x114:
  case 0x115:
  case 0x116:
    pFVar20 = ls->fs;
    suffixedexp(ls,(expdesc *)&tidx.int_value);
    iVar9 = (ls->t).token;
    if ((iVar9 == 0x3d) || (iVar9 == 0x2c)) {
      tidx.type_map = 0;
      tidx.is_constant = 0;
      assignment(ls,(LHS_assign *)&tidx,1);
    }
    else {
      if (tidx.int_value != 0xd) {
        pcVar19 = "syntax error";
LAB_0011ba11:
        luaX_syntaxerror(ls,pcVar19);
      }
      *(undefined1 *)((long)pFVar20->f->code + (long)(int)aaStack_688[0]._0_4_ * 4 + 2) = 1;
    }
  }
  pFVar20 = ls->fs;
  if ((pFVar20->freereg <= pFVar20->f->maxstacksize) && (pFVar20->nactvar <= pFVar20->freereg)) {
    pFVar20->freereg = pFVar20->nactvar;
    puVar1 = &ls->L->nCcalls;
    *puVar1 = *puVar1 - 1;
    return;
  }
  __assert_fail("ls->fs->f->maxstacksize >= ls->fs->freereg && ls->fs->freereg >= ls->fs->nactvar",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                ,0x9b7,"void statement(LexState *)");
}

Assistant:

static void statement (LexState *ls) {
  int line = ls->linenumber;  /* may be needed for error messages */
  enterlevel(ls);
  switch (ls->t.token) {
    case ';': {  /* stat -> ';' (empty statement) */
      luaX_next(ls);  /* skip ';' */
      break;
    }
    case TK_IF: {  /* stat -> ifstat */
      ifstat(ls, line);
      break;
    }
    case TK_WHILE: {  /* stat -> whilestat */
      whilestat(ls, line);
      break;
    }
    case TK_DO: {  /* stat -> DO block END */
      luaX_next(ls);  /* skip DO */
      block(ls);
      check_match(ls, TK_END, TK_DO, line);
      break;
    }
    case TK_FOR: {  /* stat -> forstat */
      forstat(ls, line);
      break;
    }
    case TK_REPEAT: {  /* stat -> repeatstat */
      repeatstat(ls, line);
      break;
    }
    case TK_FUNCTION: {  /* stat -> funcstat */
      funcstat(ls, line);
      break;
    }
    case TK_LOCAL: {  /* stat -> localstat */
      luaX_next(ls);  /* skip LOCAL */
      if (testnext(ls, TK_FUNCTION))  /* local function? */
#ifdef RAVI_DEFER_STATEMENT
        localfunc(ls, 0);
#else
        localfunc(ls);
#endif
      else
        localstat(ls);
      break;
    }
#ifdef RAVI_DEFER_STATEMENT
    case TK_DEFER: {  /* stat -> deferstat */
      luaX_next(ls);  /* skip DEFER */
      localfunc(ls, 1);
      break;
    }
#endif
    case TK_DBCOLON: {  /* stat -> label */
      luaX_next(ls);  /* skip double colon */
      labelstat(ls, str_checkname(ls), line);
      break;
    }
    case TK_RETURN: {  /* stat -> retstat */
      luaX_next(ls);  /* skip RETURN */
      retstat(ls);
      break;
    }
    case TK_BREAK:   /* stat -> breakstat */
    case TK_GOTO: {  /* stat -> 'goto' NAME */
      gotostat(ls, luaK_jump(ls->fs));
      break;
    }
    default: {  /* stat -> func | assignment */
      exprstat(ls);
      break;
    }
  }
  lua_assert(ls->fs->f->maxstacksize >= ls->fs->freereg &&
             ls->fs->freereg >= ls->fs->nactvar);
  ls->fs->freereg = ls->fs->nactvar;  /* free registers */
  leavelevel(ls);
}